

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

char * map2json_create(map2json_t *obj)

{
  bool bVar1;
  int iVar2;
  map2json_tree_t *pmVar3;
  stringlib_tokens_t *tokens;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __size;
  s_map2json_tree **ppsVar7;
  s_map2json_tree *psVar8;
  s_map2json_tree **ppsVar9;
  s_map2json_tree *psVar10;
  s_stringlib_token *token;
  map2json_keyvalue_t *pmVar11;
  long lVar12;
  
  map2json_freeTreeMemory(obj->tree);
  pmVar3 = map2json_createEmptyTreeObject((char *)0x0);
  obj->tree = pmVar3;
  pmVar11 = obj->pairs;
  do {
    if (pmVar11 == (map2json_keyvalue_t *)0x0) {
      safe_strcpy(obj->buffer,"");
      map2json_createJsonString(obj->buffer,obj->tree);
      return obj->buffer->data;
    }
    tokens = stringlib_splitTokens(pmVar11->key,'.');
    psVar8 = pmVar3;
    for (token = tokens; token != (stringlib_tokens_t *)0x0; token = token->next) {
      pcVar4 = stringlib_getToken(token,pmVar11->key);
      pcVar5 = strchr(pcVar4,0x5b);
      bVar1 = true;
      if ((pcVar5 == (char *)0x0) || (pcVar6 = strchr(pcVar4,0x5d), pcVar5 == pcVar4)) {
        lVar12 = -1;
      }
      else {
        lVar12 = -1;
        if (pcVar6 != (char *)0x0) {
          __size = strlen(pcVar5 + 1);
          pcVar6 = (char *)calloc(1,__size);
          memcpy(pcVar6,pcVar5 + 1,__size);
          pcVar6[__size - 1] = '\0';
          if (pcVar5[1] == 'x') {
            free(pcVar6);
            lVar12 = -2;
          }
          else {
            iVar2 = atoi(pcVar6);
            free(pcVar6);
            lVar12 = (long)iVar2;
          }
          *pcVar5 = '\0';
          bVar1 = false;
        }
      }
      ppsVar7 = &psVar8->children;
      ppsVar9 = ppsVar7;
      while (psVar8 = *ppsVar9, psVar8 != (s_map2json_tree *)0x0) {
        iVar2 = strcmp(psVar8->key,pcVar4);
        if (iVar2 == 0) {
          psVar10 = psVar8;
          if (bVar1) goto LAB_00104976;
          goto LAB_0010492f;
        }
        ppsVar9 = &psVar8->next;
      }
      psVar8 = map2json_createEmptyTreeObject(pcVar4);
      psVar8->next = *ppsVar7;
      *ppsVar7 = psVar8;
      if (!bVar1) {
        psVar8->type = JSMN_ARRAY;
        psVar10 = psVar8;
LAB_0010492f:
        psVar8 = psVar10;
        if (lVar12 != -2) {
          ppsVar9 = &psVar10->arrayObjects;
          ppsVar7 = ppsVar9;
          while (psVar8 = *ppsVar7, psVar8 != (s_map2json_tree *)0x0) {
            if (psVar8->arrayId == lVar12) goto LAB_00104976;
            ppsVar7 = &psVar8->arrayObjects;
          }
          psVar8 = map2json_createEmptyTreeObject((char *)0x0);
          if (psVar10->maxArrayId < lVar12) {
            psVar10->maxArrayId = lVar12 + 1;
          }
          psVar8->arrayId = lVar12;
          psVar8->arrayObjects = *ppsVar9;
          *ppsVar9 = psVar8;
        }
      }
LAB_00104976:
      free(pcVar4);
    }
    pcVar4 = pmVar11->value;
    if (psVar8->type == JSMN_ARRAY) {
      iVar2 = atoi(pcVar4);
      psVar8->maxArrayId = (long)iVar2;
    }
    else {
      iVar2 = stringlib_isInteger(pcVar4);
      if ((((iVar2 == 0) && (iVar2 = strcmp(pcVar4,"null"), iVar2 != 0)) &&
          (iVar2 = strcmp(pcVar4,"true"), iVar2 != 0)) &&
         ((iVar2 = strcmp(pcVar4,"false"), iVar2 != 0 && (*pcVar4 != '\x1b')))) {
        psVar8->type = JSMN_STRING;
      }
      else {
        psVar8->type = JSMN_PRIMITIVE;
        psVar8->value = pcVar4;
        if (*pcVar4 != '\x1b') goto LAB_001049cd;
        pcVar4 = pcVar4 + 1;
      }
      psVar8->value = pcVar4;
    }
LAB_001049cd:
    pmVar11 = pmVar11->next;
    stringlib_freeTokens(tokens);
  } while( true );
}

Assistant:

char *map2json_create(map2json_t *obj) {
	DEBUG_PUT("map2json_create([map2json_t *])... ");

	map2json_freeTreeMemory(obj->tree);

	map2json_createTree(obj);
	safe_strcpy(obj->buffer, "");
	map2json_createJsonString(obj->buffer, obj->tree);

	DEBUG_PUT("map2json_create([map2json_t *])... DONE");
	return obj->buffer->data;
}